

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

void dummy_OP_CloneBlockScope(void)

{
  return;
}

Assistant:

Var JavascriptOperators::OP_IsInst(Var instance, Var aClass, ScriptContext* scriptContext, IsInstInlineCache* inlineCache)
    {
        JIT_HELPER_REENTRANT_HEADER(ScrObj_OP_IsInst);
        if (!VarIs<RecyclableObject>(aClass))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_Operand_Invalid_NeedFunction, _u("instanceof"));
        }

        RecyclableObject* constructor = VarTo<RecyclableObject>(aClass);
        if (VarIs<JavascriptFunction>(constructor))
        {
            JavascriptFunction* func = VarTo<JavascriptFunction>(constructor);
            if (func->IsBoundFunction())
            {
                BoundFunction* boundFunc = (BoundFunction*)func;
                constructor = boundFunc->GetTargetFunction();
            }
        }
            
        Var instOfHandler = JavascriptOperators::GetPropertyNoCache(constructor,
            PropertyIds::_symbolHasInstance, scriptContext);
        if (JavascriptOperators::IsUndefinedObject(instOfHandler))
        {
            return JavascriptBoolean::ToVar(constructor->HasInstance(instance, scriptContext, inlineCache), scriptContext);
        }
        else
        {
            if (!JavascriptConversion::IsCallable(instOfHandler))
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_Property_NeedFunction, _u("Symbol[Symbol.hasInstance]"));
            }

            ThreadContext * threadContext = scriptContext->GetThreadContext();
            RecyclableObject *instFunc = VarTo<RecyclableObject>(instOfHandler);
            Var result = threadContext->ExecuteImplicitCall(instFunc, ImplicitCall_Accessor, [=]()->Js::Var
            {
                return CALL_FUNCTION(scriptContext->GetThreadContext(), instFunc, CallInfo(CallFlags_Value, 2), constructor, instance);
            });

            return  JavascriptBoolean::ToVar(JavascriptConversion::ToBoolean(result, scriptContext) ? TRUE : FALSE, scriptContext);
        }
        JIT_HELPER_END(ScrObj_OP_IsInst);
    }